

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall prometheus::anon_unknown_0::IntegrationTest::SetUp(IntegrationTest *this)

{
  pointer *this_00;
  pointer this_01;
  reference pvVar1;
  string local_a8;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> ports;
  IntegrationTest *this_local;
  
  this_00 = &ports.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  detail::make_unique<prometheus::Exposer,char_const(&)[12]>
            ((detail *)this_00,(char (*) [12])"127.0.0.1:0");
  std::unique_ptr<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>::operator=
            (&this->exposer_,
             (unique_ptr<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_> *)this_00);
  std::unique_ptr<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>::~unique_ptr
            ((unique_ptr<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_> *)this_00);
  this_01 = std::unique_ptr<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>::
            operator->(&this->exposer_);
  Exposer::GetListeningPorts((vector<int,_std::allocator<int>_> *)local_30,this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"http://127.0.0.1:",&local_71);
  pvVar1 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)local_30,0);
  std::__cxx11::to_string(&local_a8,*pvVar1);
  std::operator+(&local_50,&local_70,&local_a8);
  std::__cxx11::string::operator=((string *)&this->base_url_,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return;
}

Assistant:

void SetUp() override {
    exposer_ = detail::make_unique<Exposer>("127.0.0.1:0");
    auto ports = exposer_->GetListeningPorts();
    base_url_ = std::string("http://127.0.0.1:") + std::to_string(ports.at(0));
  }